

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Platform.cpp
# Opt level: O0

uint8_t __thiscall
GmmLib::PlatformInfoGen11::ValidateMMC(PlatformInfoGen11 *this,GMM_TEXTURE_INFO *Surf)

{
  uint8_t uVar1;
  GMM_PLATFORM_INFO *pGVar2;
  GMM_TEXTURE_INFO *Surf_local;
  PlatformInfoGen11 *this_local;
  
  if ((((ulong)(Surf->Flags).Gpu >> 0x10 & 1) == 0) ||
     (((((((ulong)(Surf->Flags).Info >> 0x24 & 1) != 0 ||
         (((ulong)(Surf->Flags).Info >> 0x2b & 1) != 0)) ||
        (((ulong)(Surf->Flags).Info >> 0x26 & 1) != 0)) ||
       (((ulong)(Surf->Flags).Info >> 0x2c & 1) != 0)) && (Surf->ArraySize < 0x41)))) {
    pGVar2 = Context::GetPlatformInfo
                       ((this->super_PlatformInfoGen10).super_PlatformInfo.pGmmLibContext);
    if (((((pGVar2->Platform).eProductFamily == IGFX_LAKEFIELD) &&
         (((ulong)(Surf->Flags).Gpu >> 0x10 & 1) != 0)) &&
        (((ulong)(Surf->Flags).Gpu >> 0x25 & 1) != 0)) &&
       ((((ulong)(Surf->Flags).Info >> 0x24 & 1) == 0 ||
        ((Surf->Format != GMM_FORMAT_NV12 && (uVar1 = GmmIsP0xx(Surf->Format), uVar1 == '\0')))))) {
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = '\x01';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

uint8_t GmmLib::PlatformInfoGen11::ValidateMMC(GMM_TEXTURE_INFO &Surf)
{

    if(Surf.Flags.Gpu.MMC && //For Media Memory Compression --
       ((!(GMM_IS_4KB_TILE(Surf.Flags) || GMM_IS_64KB_TILE(Surf.Flags))) ||
        Surf.ArraySize > GMM_MAX_MMC_INDEX))
    {
        return 0;
    }

    if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_LAKEFIELD)
    {
        if(Surf.Flags.Gpu.MMC &&
           Surf.Flags.Gpu.UnifiedAuxSurface &&
           !(Surf.Flags.Info.TiledY &&
             (Surf.Format == GMM_FORMAT_NV12 || GmmIsP0xx(Surf.Format))))
        {
            GMM_ASSERTDPF(0, "Invalid MMC usage for LKF!");
            return 0;
        }
    }
    return 1;
}